

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_CHARACTER::Load
          (_Type_CHARACTER *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *this_00;
  Character *this_01;
  Object *this_02;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint id;
  Object *pOVar5;
  long *plVar6;
  long in_R8;
  Variable V;
  Variable local_68;
  Object *local_58;
  Nullable<LiteScript::Variable> local_50;
  
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  iVar4 = std::istream::get();
  this_00 = object->memory;
  plVar6 = (long *)((long)(this_00->arr)._M_elems + in_R8);
  if ((caller & 1) != 0) {
    caller = *(undefined8 *)(*plVar6 + -1 + caller);
  }
  local_58 = object;
  id = (*(code *)caller)(plVar6,stream);
  Memory::GetVariable(&local_50,this_00,id);
  Variable::Variable(&local_68,(Variable *)&local_50);
  this_02 = local_58;
  if (local_50.is_null == false) {
    Variable::~Variable((Variable *)&local_50);
  }
  Object::Reassign(this_02,(Type *)_type_character,0x38);
  this_01 = (Character *)this_02->data;
  pOVar5 = Variable::operator->(&local_68);
  Character::Character
            (this_01,(String *)pOVar5->data,
             iVar4 << 0x18 | (uVar3 & 0xff) << 0x10 | (uVar2 & 0xff) << 8 | uVar1 & 0xff);
  Nullable<LiteScript::Variable>::operator=
            ((Nullable<LiteScript::Variable> *)((long)this_02->data + 0x10),&local_68);
  Variable::~Variable(&local_68);
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    unsigned int index = IStreamer::Read<unsigned int>(stream);
    Variable V = *object.memory.GetVariable((object.memory.*caller)(stream));
    object.Reassign(_type_character, sizeof(Character));
    std::allocator<Character> allocator;
    allocator.construct(&object.GetData<Character>(), V->GetData<String>(), index);
    object.GetData<Character>().obj_string = V;
}